

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_Single_Test::TestBody
          (MessageDifferencerTest_IgnoreField_Single_Test *this)

{
  FieldDescriptor *field;
  allocator<char> local_289;
  string local_288;
  TestField msg1;
  TestField msg2;
  MessageDifferencer differencer;
  
  proto2_unittest::TestField::TestField(&msg1);
  proto2_unittest::TestField::TestField(&msg2);
  msg1.field_0._impl_.c_ = 3;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  RepeatedField<int>::Add(&msg1.field_0._impl_.rc_,1);
  msg2.field_0._impl_.c_ = 5;
  msg2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       msg2.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  RepeatedField<int>::Add(&msg2.field_0._impl_.rc_,1);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"c",&local_289);
  field = GetFieldDescriptor(&msg1.super_Message,&local_288);
  util::MessageDifferencer::IgnoreField(&differencer,field);
  std::__cxx11::string::~string((string *)&local_288);
  ExpectEqualsWithDifferencer(&differencer,&msg1.super_Message,&msg2.super_Message);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestField::~TestField(&msg2);
  proto2_unittest::TestField::~TestField(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_Single) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);

  msg2.set_c(5);
  msg2.add_rc(1);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(GetFieldDescriptor(msg1, "c"));

  ExpectEqualsWithDifferencer(&differencer, msg1, msg2);
}